

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O2

void __thiscall pstore::repo::section_content::~section_content(section_content *this)

{
  std::_Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
  ~_Vector_base(&(this->xfixups).
                 super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               );
  std::_Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::
  ~_Vector_base(&(this->ifixups).
                 super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->data).big_buffer_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

explicit section_content (section_kind const kind_) noexcept
                    : kind{kind_} {}